

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBuffer.c
# Opt level: O2

JL_STATUS JlBufferAdd(JlBuffer *BufferContext,void *Data,size_t DataSize)

{
  size_t OriginalSize;
  uint8_t *puVar1;
  size_t sVar2;
  
  if (DataSize == 0 || (Data == (void *)0x0 || BufferContext == (JlBuffer *)0x0)) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  sVar2 = BufferContext->BufferUsed;
  OriginalSize = BufferContext->BufferAllocated;
  if (OriginalSize - sVar2 < DataSize) {
    puVar1 = (uint8_t *)JlRealloc(BufferContext->Buffer,OriginalSize,OriginalSize + 0x4000);
    if (puVar1 == (uint8_t *)0x0) {
      return JL_STATUS_OUT_OF_MEMORY;
    }
    BufferContext->BufferAllocated = OriginalSize + 0x4000;
    BufferContext->Buffer = puVar1;
    sVar2 = BufferContext->BufferUsed;
  }
  else {
    puVar1 = BufferContext->Buffer;
  }
  memcpy(puVar1 + sVar2,Data,DataSize);
  BufferContext->BufferUsed = BufferContext->BufferUsed + DataSize;
  return JL_STATUS_SUCCESS;
}

Assistant:

JL_STATUS
    JlBufferAdd
    (
        JlBuffer*       BufferContext,
        void const*     Data,
        size_t          DataSize
    )
{
    JL_STATUS jlStatus;

    if(     NULL != BufferContext
        &&  NULL != Data
        &&  0 != DataSize )
    {
        size_t amountLeft = BufferContext->BufferAllocated - BufferContext->BufferUsed;
        if( amountLeft < DataSize )
        {
            size_t   newSize = BufferContext->BufferAllocated + BUFFER_GROW_SIZE;
            uint8_t* newBuffer = JlRealloc( BufferContext->Buffer, BufferContext->BufferAllocated, newSize );

            if( NULL != newBuffer )
            {
                BufferContext->BufferAllocated = newSize;
                BufferContext->Buffer = newBuffer;
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            // No need to grow buffer
            jlStatus = JL_STATUS_SUCCESS;
        }

        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Append data
            memcpy( BufferContext->Buffer + BufferContext->BufferUsed, Data, DataSize );
            BufferContext->BufferUsed += DataSize;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}